

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

char * opus_tags_query(OpusTags *_tags,char *_tag,int _count)

{
  char **ppcVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  sVar3 = strlen(_tag);
  if (sVar3 < 0x80000000) {
    ppcVar1 = _tags->user_comments;
    uVar6 = (ulong)(uint)_tags->comments;
    if (_tags->comments < 1) {
      uVar6 = 0;
    }
    iVar5 = 0;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = opus_tagncompare(_tag,(int)sVar3,ppcVar1[uVar4]);
      if (iVar2 == 0) {
        if (iVar5 == _count) {
          return ppcVar1[uVar4] + sVar3 + 1;
        }
        iVar5 = iVar5 + 1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *opus_tags_query(const OpusTags *_tags,const char *_tag,int _count){
  char   **user_comments;
  size_t   tag_len;
  int      found;
  int      ncomments;
  int      ci;
  tag_len=strlen(_tag);
  if(OP_UNLIKELY(tag_len>(size_t)INT_MAX))return NULL;
  ncomments=_tags->comments;
  user_comments=_tags->user_comments;
  found=0;
  for(ci=0;ci<ncomments;ci++){
    if(!opus_tagncompare(_tag,(int)tag_len,user_comments[ci])){
      /*We return a pointer to the data, not a copy.*/
      if(_count==found++)return user_comments[ci]+tag_len+1;
    }
  }
  /*Didn't find anything.*/
  return NULL;
}